

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice_plane.cpp
# Opt level: O0

SlicePlane * polyscope::addSceneSlicePlane(bool initiallyVisible)

{
  bool bVar1;
  unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_> *__args;
  pointer pSVar2;
  byte in_DIL;
  unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_> *s;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_>,_std::allocator<std::unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_>_>_>
  *__range1;
  SlicePlane *newPlane;
  string newName;
  size_t nPlanes;
  string *in_stack_00000438;
  SlicePlane *in_stack_00000440;
  pointer in_stack_ffffffffffffff28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  SlicePlane *this;
  char *in_stack_ffffffffffffff38;
  vector<std::unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_>,_std::allocator<std::unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_>_>_>
  *this_00;
  __normal_iterator<std::unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_>_*,_std::vector<std::unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_>,_std::allocator<std::unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_>_>_>_>
  local_a8;
  undefined1 *local_a0;
  unsigned_long in_stack_ffffffffffffff68;
  string local_88 [32];
  undefined1 local_68 [24];
  vector<std::unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_>,_std::allocator<std::unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_>_>_>
  local_50;
  string local_30 [47];
  byte local_1;
  
  local_1 = in_DIL & 1;
  local_30._32_8_ =
       std::
       vector<std::unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_>,_std::allocator<std::unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_>_>_>
       ::size((vector<std::unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_>,_std::allocator<std::unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_>_>_>
               *)state::slicePlanes);
  this_00 = &local_50;
  std::__cxx11::to_string(in_stack_ffffffffffffff68);
  std::operator+(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  std::__cxx11::string::~string((string *)&local_50);
  __args = (unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_> *)
           operator_new(0x710);
  std::__cxx11::string::string(local_88,local_30);
  SlicePlane::SlicePlane(in_stack_00000440,in_stack_00000438);
  this = (SlicePlane *)local_68;
  std::unique_ptr<polyscope::SlicePlane,std::default_delete<polyscope::SlicePlane>>::
  unique_ptr<std::default_delete<polyscope::SlicePlane>,void>
            ((unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_> *)this,
             in_stack_ffffffffffffff28);
  std::
  vector<std::unique_ptr<polyscope::SlicePlane,std::default_delete<polyscope::SlicePlane>>,std::allocator<std::unique_ptr<polyscope::SlicePlane,std::default_delete<polyscope::SlicePlane>>>>
  ::emplace_back<std::unique_ptr<polyscope::SlicePlane,std::default_delete<polyscope::SlicePlane>>>
            (this_00,__args);
  std::unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_>::~unique_ptr
            ((unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_> *)
             this_00);
  std::__cxx11::string::~string(local_88);
  local_30._32_8_ = local_30._32_8_ + 1;
  std::
  vector<std::unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_>,_std::allocator<std::unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_>_>_>
  ::back((vector<std::unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_>,_std::allocator<std::unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_>_>_>
          *)this);
  pSVar2 = std::unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_>::get
                     ((unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_>
                       *)this);
  if ((local_1 & 1) == 0) {
    SlicePlane::setDrawPlane(this,SUB81((ulong)in_stack_ffffffffffffff28 >> 0x38,0));
    SlicePlane::setDrawWidget(this,SUB81((ulong)in_stack_ffffffffffffff28 >> 0x38,0));
  }
  local_a0 = state::slicePlanes;
  local_a8._M_current =
       (unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_> *)
       std::
       vector<std::unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_>,_std::allocator<std::unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_>_>_>
       ::begin((vector<std::unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_>,_std::allocator<std::unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_>_>_>
                *)in_stack_ffffffffffffff28);
  std::
  vector<std::unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_>,_std::allocator<std::unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_>_>_>
  ::end((vector<std::unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_>,_std::allocator<std::unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_>_>_>
         *)in_stack_ffffffffffffff28);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_>_*,_std::vector<std::unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_>,_std::allocator<std::unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_>_>_>_>
                        *)this,(__normal_iterator<std::unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_>_*,_std::vector<std::unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_>,_std::allocator<std::unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_>_>_>_>
                                *)in_stack_ffffffffffffff28);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_>_*,_std::vector<std::unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_>,_std::allocator<std::unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_>_>_>_>
    ::operator*(&local_a8);
    std::unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_>::operator->
              ((unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_> *)
               0x45ebf8);
    SlicePlane::resetVolumeSliceProgram((SlicePlane *)0x45ec00);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_>_*,_std::vector<std::unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_>,_std::allocator<std::unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_>_>_>_>
    ::operator++(&local_a8);
  }
  std::__cxx11::string::~string(local_30);
  return pSVar2;
}

Assistant:

SlicePlane* addSceneSlicePlane(bool initiallyVisible) {
  size_t nPlanes = state::slicePlanes.size();
  std::string newName = "Scene Slice Plane " + std::to_string(nPlanes);
  state::slicePlanes.emplace_back(std::unique_ptr<SlicePlane>(new SlicePlane(newName)));
  nPlanes++;
  SlicePlane* newPlane = state::slicePlanes.back().get();
  if (!initiallyVisible) {
    newPlane->setDrawPlane(false);
    newPlane->setDrawWidget(false);
  }
  for (std::unique_ptr<SlicePlane>& s : state::slicePlanes) {
    s->resetVolumeSliceProgram();
  }
  return newPlane;
}